

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O0

void __thiscall
glslang::TAllocation::checkGuardBlock(TAllocation *this,uchar *blockMem,uchar val,char *locText)

{
  size_t sVar1;
  uchar *puVar2;
  char local_88 [8];
  char assertMsg [80];
  ulong uStack_30;
  int maxSize;
  size_t x;
  char *locText_local;
  uchar val_local;
  uchar *blockMem_local;
  TAllocation *this_local;
  
  uStack_30 = 0;
  while( true ) {
    if (0xf < uStack_30) {
      return;
    }
    if (blockMem[uStack_30] != val) break;
    uStack_30 = uStack_30 + 1;
  }
  assertMsg[0x4c] = 'P';
  assertMsg[0x4d] = '\0';
  assertMsg[0x4e] = '\0';
  assertMsg[0x4f] = '\0';
  sVar1 = this->size;
  puVar2 = data(this);
  snprintf(local_88,0x50,"PoolAlloc: Damage %s %zu byte allocation at 0x%p\n",locText,sVar1,puVar2);
  __assert_fail("0 && \"PoolAlloc: Damage in guard block\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/PoolAlloc.cpp"
                ,0x9f,
                "void glslang::TAllocation::checkGuardBlock(unsigned char *, unsigned char, const char *) const"
               );
}

Assistant:

void TAllocation::checkGuardBlock(unsigned char*, unsigned char, const char*) const
#endif
{
#ifdef GUARD_BLOCKS
    for (size_t x = 0; x < guardBlockSize; x++) {
        if (blockMem[x] != val) {
            const int maxSize = 80;
            char assertMsg[maxSize];

            // We don't print the assert message.  It's here just to be helpful.
            snprintf(assertMsg, maxSize, "PoolAlloc: Damage %s %zu byte allocation at 0x%p\n",
                      locText, size, data());
            assert(0 && "PoolAlloc: Damage in guard block");
        }
    }
#else
    assert(guardBlockSize == 0);
#endif
}